

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O2

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getuntil
          (kstream<gzFile_s_*,_FunctorZlib> *this,Delimiter delimiter,string *str,int *dret)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  
  if (dret != (int *)0x0) {
    *dret = 0;
  }
  if (str->_M_string_length != 0) {
    str->_M_string_length = 0;
    *(str->_M_dataplus)._M_p = '\0';
  }
  iVar3 = this->begin;
  uVar2 = this->end;
  if ((iVar3 < (int)uVar2) || (this->is_eof == 0)) {
    do {
      if ((int)uVar2 <= iVar3) {
        if (this->is_eof != 0) break;
        this->begin = 0;
        uVar2 = gzread(this->f,this->buf,this->bufferSize);
        this->end = uVar2;
        if (uVar2 < this->bufferSize) {
          this->is_eof = 1;
        }
        if (uVar2 == 0) break;
      }
      uVar6 = uVar2;
      if (delimiter == EOL) {
        uVar1 = this->begin;
        pcVar5 = this->buf;
        lVar7 = (long)(int)uVar1;
        lVar4 = lVar7;
        if ((int)uVar2 < (int)uVar1) {
          uVar6 = uVar1;
        }
        for (; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
          if (pcVar5[lVar4] == '\n') {
            uVar6 = (uint)lVar4;
            break;
          }
        }
      }
      else if (delimiter == SPACE) {
        uVar1 = this->begin;
        pcVar5 = this->buf;
        lVar7 = (long)(int)uVar1;
        lVar4 = lVar7;
        if ((int)uVar2 < (int)uVar1) {
          uVar6 = uVar1;
        }
        for (; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
          iVar3 = isspace((int)pcVar5[lVar4]);
          if (iVar3 != 0) {
            uVar6 = (uint)lVar4;
            break;
          }
        }
      }
      else {
        pcVar5 = this->buf;
        lVar7 = (long)this->begin;
        uVar6 = 0;
      }
      std::__cxx11::string::append((char *)str,(ulong)(pcVar5 + lVar7));
      iVar3 = uVar6 + 1;
      this->begin = iVar3;
      uVar2 = this->end;
      if ((dret != (int *)0x0) && ((int)uVar6 < (int)uVar2)) {
        *dret = (int)this->buf[(int)uVar6];
        break;
      }
    } while ((int)uVar2 <= (int)uVar6);
    iVar3 = (int)str->_M_string_length;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int getuntil(Delimiter delimiter, std::string &str, int *dret)
    {
        if (dret)
            *dret = 0;
        if (!str.empty()) {
            str.clear();
        }

        if (this->begin >= this->end && this->is_eof)
            return -1;
        for (;;)
        {
            int i;
            if (this->begin >= this->end)
            {
                if (!this->is_eof)
                {
                    this->begin = 0;
                    this->end = this->readfunc(this->f, this->buf, bufferSize);
                    if (this->end < bufferSize)
                        this->is_eof = 1;
                    if (this->end == 0)
                        break;
                }
                else
                    break;
            }
            if (delimiter == EOL)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (this->buf[i] == '\n')
                        break;
                }
            }
            else if (delimiter == SPACE)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (isspace(this->buf[i]))
                        break;
                }
            }
            else i = 0;

            str.append(this->buf + this->begin, static_cast<unsigned long>(i - this->begin));
            this->begin = i + 1;
            if (i < this->end)
            {
                if (dret)
                    *dret = this->buf[i];
                break;
            }
        }
        return (int)str.length();
    }